

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# message_lite.cc
# Opt level: O1

bool __thiscall
google::protobuf::MessageLite::AppendPartialToString(MessageLite *this,string *output)

{
  size_type sVar1;
  int byte_size_before_serialization;
  int iVar2;
  undefined4 extraout_var;
  pointer pcVar3;
  long lVar4;
  
  sVar1 = output->_M_string_length;
  byte_size_before_serialization = (*this->_vptr_MessageLite[9])();
  pcVar3 = (pointer)0x0;
  std::__cxx11::string::resize((ulong)output,(char)byte_size_before_serialization + (char)sVar1);
  if (output->_M_string_length != 0) {
    pcVar3 = (output->_M_dataplus)._M_p;
  }
  iVar2 = (*this->_vptr_MessageLite[0xb])(this,pcVar3 + (int)sVar1);
  lVar4 = CONCAT44(extraout_var,iVar2) - (long)(pcVar3 + (int)sVar1);
  if (lVar4 != byte_size_before_serialization) {
    iVar2 = (*this->_vptr_MessageLite[9])(this);
    anon_unknown_9::ByteSizeConsistencyError(byte_size_before_serialization,iVar2,(int)lVar4);
  }
  return true;
}

Assistant:

bool MessageLite::AppendPartialToString(string* output) const {
  int old_size = output->size();
  int byte_size = ByteSize();
  STLStringResizeUninitialized(output, old_size + byte_size);
  uint8* start = reinterpret_cast<uint8*>(string_as_array(output) + old_size);
  uint8* end = SerializeWithCachedSizesToArray(start);
  if (end - start != byte_size) {
    ByteSizeConsistencyError(byte_size, ByteSize(), end - start);
  }
  return true;
}